

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.h
# Opt level: O0

void __thiscall
ClownLZSS::Internal::BitField::
WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
::Push(WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
       *this,bool bit)

{
  anon_class_8_1_8991fb9c local_28;
  anon_class_8_1_8991fb9c *local_20;
  anon_class_8_1_8991fb9c *CheckWriteBits;
  WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
  *pWStack_10;
  bool bit_local;
  WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
  *this_local;
  
  local_20 = &local_28;
  local_28.this = this;
  CheckWriteBits._7_1_ = bit;
  pWStack_10 = this;
  Push::anon_class_8_1_8991fb9c::operator()(local_20);
  this->bits = this->bits >> 1;
  this->bits = (long)(int)((uint)(CheckWriteBits._7_1_ & 1) << 7) | this->bits;
  this->bits_remaining = this->bits_remaining - 1;
  return;
}

Assistant:

void Push(const bool bit)
				{
					const auto &CheckWriteBits = [&]()
					{
						if (bits_remaining == 0)
						{
							WriteBits();
						}
					};

					if constexpr(write_when == WriteWhen::BeforePush)
						CheckWriteBits();

					if constexpr(push_where == PushWhere::High)
					{
						bits >>= 1;
						bits |= bit << (total_bits - 1);
					}
					else //if constexpr(push_where == PushWhere::Low)
					{
						bits <<= 1;
						bits |= bit;
					}

					--bits_remaining;

					if constexpr(write_when == WriteWhen::AfterPush)
						CheckWriteBits();
				}